

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall
embree::Camera::Camera(Camera *this,PerspectiveCameraData *cam,Handedness handedness)

{
  undefined8 uVar1;
  Handedness handedness_local;
  PerspectiveCameraData *cam_local;
  Camera *this_local;
  
  uVar1 = *(undefined8 *)((long)&(cam->from).field_0 + 8);
  *(undefined8 *)&(this->from).field_0 = *(undefined8 *)&(cam->from).field_0;
  *(undefined8 *)((long)&(this->from).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(cam->to).field_0 + 8);
  *(undefined8 *)&(this->to).field_0 = *(undefined8 *)&(cam->to).field_0;
  *(undefined8 *)((long)&(this->to).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(cam->up).field_0 + 8);
  *(undefined8 *)&(this->up).field_0 = *(undefined8 *)&(cam->up).field_0;
  *(undefined8 *)((long)&(this->up).field_0 + 8) = uVar1;
  this->fov = cam->fov;
  this->handedness = handedness;
  return;
}

Assistant:

Camera (const SceneGraph::PerspectiveCameraData& cam, Handedness handedness)
    : from(cam.from), to(cam.to), up(cam.up), fov(cam.fov), handedness(handedness) {}